

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.cpp
# Opt level: O3

bool __thiscall Kernel::RobSubstitution::unify(RobSubstitution *this,TermSpec s,TermSpec t)

{
  BacktrackData ***pppBVar1;
  BacktrackData **ppBVar2;
  BacktrackObject *pBVar3;
  BacktrackData BVar4;
  pair<Kernel::TermSpec,_Kernel::TermSpec> *ppVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  BacktrackData **ppBVar9;
  TermSpec *pTVar10;
  Entry *pEVar11;
  VarSpec v;
  VarSpec v_00;
  TermSpec b;
  TermSpec b_00;
  TermSpec dt2;
  TermSpec dt1;
  BacktrackData localBD;
  pair<Kernel::TermSpec,_Kernel::TermSpec> x;
  TermSpec local_1a8;
  TermSpec local_198;
  BacktrackData local_180;
  undefined1 local_178 [16];
  TermList local_168;
  TermList TStack_160;
  DHMap<Kernel::VarSpec,_Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *local_150;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_hpp:120:59),_Kernel::TermSpec>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
  local_148;
  Option<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_> local_118;
  TermList local_e8;
  uint64_t uStack_e0;
  TermList local_d8;
  uint64_t uStack_d0;
  TermSpec local_c8;
  TermSpec local_b8;
  uint64_t local_a8;
  undefined8 uStack_a0;
  uint64_t local_98;
  undefined8 uStack_90;
  TermSpec local_80;
  TermSpec local_70;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_hpp:120:59),_Kernel::TermSpec>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
  *local_60;
  Option<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_> local_58;
  
  local_80.term = t.term._content;
  local_70.term = s.term._content;
  local_70.index = s.index;
  local_80.index = t.index;
  bVar7 = TermSpec::sameTermContent(&local_70,&local_80);
  if (!bVar7) {
    local_180._boList = (BacktrackObject *)0x0;
    ppBVar9 = (this->super_Backtrackable)._bdStack._cursor;
    if (ppBVar9 == (this->super_Backtrackable)._bdStack._end) {
      Lib::Stack<Lib::BacktrackData_*>::expand((Stack<Lib::BacktrackData_*> *)this);
      ppBVar9 = (this->super_Backtrackable)._bdStack._cursor;
    }
    *ppBVar9 = &local_180;
    pppBVar1 = &(this->super_Backtrackable)._bdStack._cursor;
    *pppBVar1 = *pppBVar1 + 1;
    if ((unify(Kernel::TermSpec,Kernel::TermSpec)::toDo == '\0') &&
       (iVar8 = __cxa_guard_acquire(&unify(Kernel::TermSpec,Kernel::TermSpec)::toDo), iVar8 != 0)) {
      unify::toDo._capacity = 0x40;
      unify::toDo._stack = (pair<Kernel::TermSpec,_Kernel::TermSpec> *)::operator_new(0x800,0x10);
      unify::toDo._end = unify::toDo._stack + unify::toDo._capacity;
      unify::toDo._cursor = unify::toDo._stack;
      __cxa_atexit(Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>::~Stack,&unify::toDo,
                   &__dso_handle);
      __cxa_guard_release(&unify(Kernel::TermSpec,Kernel::TermSpec)::toDo);
    }
    uStack_a0 = CONCAT44(local_70._12_4_,local_70.index);
    local_a8 = local_70.term._content;
    uStack_90 = CONCAT44(local_80._12_4_,local_80.index);
    local_98 = local_80.term._content;
    if (unify::toDo._cursor == unify::toDo._end) {
      Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>::expand(&unify::toDo);
    }
    ppVar5 = unify::toDo._cursor;
    ((unify::toDo._cursor)->second).term._content = local_98;
    *(undefined8 *)&(ppVar5->second).index = uStack_90;
    (ppVar5->first).term._content = local_a8;
    *(undefined8 *)&(ppVar5->first).index = uStack_a0;
    unify::toDo._cursor = unify::toDo._cursor + 1;
    if (unify(Kernel::TermSpec,Kernel::TermSpec)::encountered_ == '\0') {
      unify();
    }
    Lib::
    DHMap<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::reset(&unify::encountered_._map);
    if (unify::toDo._cursor != unify::toDo._stack) {
      local_150 = &this->_bindings;
      do {
        local_c8.term._content = unify::toDo._cursor[-1].first.term._content;
        local_c8.index = unify::toDo._cursor[-1].first.index;
        local_c8._12_4_ = *(undefined4 *)&unify::toDo._cursor[-1].first.field_0xc;
        local_b8.term._content = unify::toDo._cursor[-1].second.term._content;
        local_b8.index = unify::toDo._cursor[-1].second.index;
        local_b8._12_4_ = *(undefined4 *)&unify::toDo._cursor[-1].second.field_0xc;
        unify::toDo._cursor = unify::toDo._cursor + -1;
        pTVar10 = derefBound(this,&local_c8);
        local_198.term._content = (pTVar10->term)._content;
        local_198.index = pTVar10->index;
        local_198._12_4_ = *(undefined4 *)&pTVar10->field_0xc;
        pTVar10 = derefBound(this,&local_b8);
        local_1a8.term._content = (pTVar10->term)._content;
        local_1a8.index = (int)*(undefined8 *)&pTVar10->index;
        local_1a8._12_4_ = SUB84((ulong)*(undefined8 *)&pTVar10->index >> 0x20,0);
        bVar7 = TermSpec::sameTermContent(&local_198,&local_1a8);
        if (!bVar7) {
          if ((local_198.term._content & 1) != 0) {
            local_148._iter._func.other._iter._func.this = (TermSpec *)local_198.term._content;
            local_148._iter._func.other._iter._inner._next = local_198.index;
            bVar7 = occurs(this,(VarSpec *)&local_148,&local_1a8);
            if (!bVar7) {
              local_148._iter._func.other._iter._func.this = (TermSpec *)local_198.term._content;
              local_148._iter._func.other._iter._inner._next = local_198.index;
              b.index = local_1a8.index;
              b.term._content = local_1a8.term._content;
              b._12_4_ = 0;
              bind<Kernel::TermSpec,Lib::DefaultHash,Lib::DefaultHash2>
                        (this,local_150,(VarSpec *)&local_148,b);
              goto LAB_005a8034;
            }
          }
          if ((local_1a8.term._content & 1) != 0) {
            local_148._iter._func.other._iter._func.this = (TermSpec *)local_1a8.term._content;
            local_148._iter._func.other._iter._inner._next = local_1a8.index;
            bVar7 = occurs(this,(VarSpec *)&local_148,&local_198);
            if (!bVar7) {
              local_148._iter._func.other._iter._func.this = (TermSpec *)local_1a8.term._content;
              local_148._iter._func.other._iter._inner._next = local_1a8.index;
              b_00.index = local_198.index;
              b_00.term._content = local_198.term._content;
              b_00._12_4_ = 0;
              bind<Kernel::TermSpec,Lib::DefaultHash,Lib::DefaultHash2>
                        (this,local_150,(VarSpec *)&local_148,b_00);
              goto LAB_005a8034;
            }
          }
          if ((((local_198.term._content & 3) != 0) || ((local_1a8.term._content & 3) != 0)) ||
             (*(int *)(local_198.term._content + 8) != *(int *)(local_1a8.term._content + 8))) {
            unify::toDo._cursor = unify::toDo._stack;
            pppBVar1 = &(this->super_Backtrackable)._bdStack._cursor;
            *pppBVar1 = *pppBVar1 + -1;
            BVar4._boList = local_180._boList;
            while (BVar4._boList != (BacktrackObject *)0x0) {
              (*(BVar4._boList)->_vptr_BacktrackObject[2])(BVar4._boList);
              pBVar3 = (BVar4._boList)->_next;
              (*(BVar4._boList)->_vptr_BacktrackObject[1])(BVar4._boList);
              BVar4._boList = pBVar3;
            }
            return false;
          }
          local_148._iter._inner._inner._to = *(uint *)(local_198.term._content + 0xc) & 0xfffffff;
          local_148._iter._func.other._iter._inner._to =
               *(uint *)(local_1a8.term._content + 0xc) & 0xfffffff;
          local_148._iter._func.other._iter._func.this = &local_1a8;
          local_148._iter._func.other._iter._inner._next = 0;
          local_148._iter._func.other._iter._inner._from = 0;
          local_148._iter._inner._func.this = &local_198;
          local_148._iter._inner._inner._next = 0;
          local_148._iter._inner._inner._from = 0;
          local_60 = &local_148;
          Lib::
          IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/RobSubstitution.hpp:120:59),_Kernel::TermSpec>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
          ::tryNext(&local_58,&local_148);
          if (local_58.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._isSome ==
              true) {
            do {
              local_e8._content =
                   (uint64_t)
                   local_58.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                   _elem.init.first.term._content;
              uStack_e0 = local_58.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                          _elem._elem._8_8_;
              local_d8._content =
                   (uint64_t)
                   local_58.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                   _elem.init.second.term._content;
              uStack_d0 = local_58.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                          _elem._elem._24_8_;
              local_178._0_8_ =
                   local_58.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                   _elem.init.first.term._content;
              local_178._8_8_ =
                   local_58.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                   _elem._8_8_;
              uVar6 = local_178._8_8_;
              local_168._content =
                   (uint64_t)
                   local_58.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                   _elem.init.second.term._content;
              TStack_160._content =
                   local_58.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                   _elem._24_8_;
              if (((ulong)local_58.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                          _elem._elem.init.first.term._content & 1) == 0) {
LAB_005a7efa:
                pEVar11 = Lib::
                          DHMap<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                          ::findEntry(&unify::encountered_._map,
                                      (pair<Kernel::TermSpec,_Kernel::TermSpec> *)local_178);
                if (pEVar11 == (Entry *)0x0) {
                  Lib::
                  DHMap<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                  ::insert(&unify::encountered_._map);
                  local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                  _elem._8_8_ = local_168._content;
                  local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                  _elem.init.second.term._content = (TermList)(TermList)TStack_160._content;
                  local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._0_8_ =
                       local_178._0_8_;
                  local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                  _elem.init.first.term._content = (TermList)(TermList)local_178._8_8_;
                  if (unify::toDo._cursor == unify::toDo._end) {
                    Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>::expand(&unify::toDo)
                    ;
                  }
                  goto LAB_005a7f62;
                }
              }
              else {
                local_178._8_4_ =
                     (undefined4)
                     local_58.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem
                     ._elem._8_8_;
                v.index = local_178._8_4_;
                v._self._content =
                     (uint64_t)
                     local_58.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem
                     ._elem.init.first.term._content;
                v._12_4_ = 0;
                local_178._8_8_ = uVar6;
                bVar7 = isUnbound(this,v);
                if ((!bVar7) || ((local_168._content & 1) == 0)) goto LAB_005a7efa;
                v_00.index = (int)TStack_160._content;
                v_00._self._content = local_168._content;
                v_00._12_4_ = 0;
                bVar7 = isUnbound(this,v_00);
                if (!bVar7) goto LAB_005a7efa;
                local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                _elem._8_8_ = local_168._content;
                local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                _elem.init.second.term._content = (TermList)(TermList)TStack_160._content;
                local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._0_8_ =
                     local_178._0_8_;
                local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                _elem.init.first.term._content = (TermList)(TermList)local_178._8_8_;
                if (unify::toDo._cursor == unify::toDo._end) {
                  Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>::expand(&unify::toDo);
                }
LAB_005a7f62:
                ppVar5 = unify::toDo._cursor;
                ((unify::toDo._cursor)->second).term._content =
                     local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                     _elem._elem._8_8_;
                *(TermList *)&(ppVar5->second).index =
                     local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                     _elem._elem.init.second.term._content;
                (ppVar5->first).term._content =
                     local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                     _0_8_;
                *(TermList *)&(ppVar5->first).index =
                     local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                     _elem._elem.init.first.term._content;
                unify::toDo._cursor = unify::toDo._cursor + 1;
              }
              Lib::
              IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/RobSubstitution.hpp:120:59),_Kernel::TermSpec>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
              ::tryNext(&local_118,local_60);
              if (local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._isSome
                  == false) break;
              local_58.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem._elem.
              init.first.term._content =
                   local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                   _elem.init.first.term._content;
              local_58.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem._elem.
              _8_8_ = local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                      _elem._elem._8_8_;
              local_58.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem._elem.
              init.second.term._content =
                   local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                   _elem.init.second.term._content;
              local_58.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem._elem.
              _24_8_ = local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                       _elem._elem._24_8_;
              local_58.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._isSome =
                   local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                   _isSome;
            } while( true );
          }
        }
LAB_005a8034:
      } while (unify::toDo._cursor != unify::toDo._stack);
    }
    ppBVar2 = (this->super_Backtrackable)._bdStack._cursor;
    ppBVar9 = ppBVar2 + -1;
    (this->super_Backtrackable)._bdStack._cursor = ppBVar9;
    BVar4._boList = local_180._boList;
    if ((ppBVar9 != (this->super_Backtrackable)._bdStack._stack) &&
       (ppBVar2[-2] != (BacktrackData *)0x0)) {
      Lib::Backtrackable::bdCommit(&this->super_Backtrackable,&local_180);
      BVar4._boList = local_180._boList;
    }
    while (BVar4._boList != (BacktrackObject *)0x0) {
      pBVar3 = (BVar4._boList)->_next;
      (*(BVar4._boList)->_vptr_BacktrackObject[1])();
      BVar4._boList = pBVar3;
    }
  }
  return true;
}

Assistant:

bool RobSubstitution::unify(TermSpec s, TermSpec t)
{
#define DEBUG_UNIFY(lvl, ...) if (lvl < 0) DBG("unify: ", __VA_ARGS__)
  DEBUG_UNIFY(0, *this, ".unify(", s, ",", t, ")")


  if(s.sameTermContent(t)) {
    return true;
  }

  BacktrackData localBD;
  bdRecord(localBD);

  static Stack<pair<TermSpec, TermSpec>> toDo(64);
  ASS(toDo.isEmpty());
  toDo.push(make_pair(std::move(s), std::move(t)));

  // Save encountered unification pairs to avoid
  // recomputing their unification
  static DHSet<pair<TermSpec, TermSpec>> encountered_;
  auto encountered = &encountered_;
  encountered->reset();
  

  auto pushTodo = [&](auto pair) {
      // we unify each subterm pair at most once, to avoid worst-case exponential runtimes
      // in order to safe memory we do ot do this for variables.
      // (Note by joe:  didn't make this decision, but just keeping the implemenntation 
      // working as before. i.e. as described in the paper "Comparing Unification 
      // Algorithms in First-Order Theorem Proving", by Krystof and Andrei)
      if (pair.first.isVar() && isUnbound(pair.first.varSpec()) &&
          pair.second.isVar() && isUnbound(pair.second.varSpec())) {
        toDo.push(std::move(pair));
      } else if (!encountered->find(pair)) {
        encountered->insert(pair);
        toDo.push(std::move(pair));
      }
  };

  bool mismatch=false;
  // Iteratively resolve unification pairs in toDo
  // the current pair is always in t1 and t2 with their dereferenced
  // version in dt1 and dt2
  while (toDo.isNonEmpty()) {
    auto x = toDo.pop();
    TermSpec dt1 = derefBound(x.first);
    TermSpec dt2 = derefBound(x.second);
    DEBUG_UNIFY(1, "next pair: ", tie(dt1, dt2))
    // If they have the same content then skip
    // (note that sameTermContent is best-effort)
    if (dt1.sameTermContent(dt2)) {
    // Deal with the case where eithe rare variables
    // Do an occurs-check and note that the variable 
    // cannot be currently bound as we already dereferenced
    } else if(dt1.isVar() && !occurs(dt1.varSpec(), dt2)) {
      bind(dt1.varSpec(), dt2);

    } else if(dt2.isVar() && !occurs(dt2.varSpec(), dt1)) {
      bind(dt2.varSpec(), dt1);

    } else if(dt1.isTerm() && dt2.isTerm() 
           && dt1.functor() == dt2.functor()) {

      for (auto c : dt1.allArgs().zip(dt2.allArgs())) {
        pushTodo(make_pair(std::move(c.first), std::move(c.second)));
      }

    } else {
      mismatch = true;
      break;
    }

    ASS(!mismatch)
  }

  if(mismatch) {
    toDo.reset();
  }

  bdDone();

  if(mismatch) {
    localBD.backtrack();
  } else {
    if(bdIsRecording()) {
      bdCommit(localBD);
    }
    localBD.drop();
  }

  DEBUG_UNIFY(0, *this)
  return !mismatch;
}